

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int raviX_parse(CompilerState *compiler_state,char *buffer,size_t buflen,char *name)

{
  _Bool *p_Var1;
  int iVar2;
  LexerState *ls;
  AstNode *pAVar3;
  ParserState parser_state;
  ParserState local_38;
  
  ls = raviX_init_lexer(compiler_state,buffer,buflen,name);
  local_38.current_function = (AstNode *)0x0;
  local_38.current_scope = (Scope *)0x0;
  local_38.ls = ls;
  local_38.compiler_state = compiler_state;
  iVar2 = _setjmp((__jmp_buf_tag *)compiler_state->env);
  if (iVar2 == 0) {
    raviX_next(local_38.ls);
    pAVar3 = new_function(&local_38);
    (local_38.compiler_state)->main_function = pAVar3;
    p_Var1 = &(pAVar3->field_2).embedded_C_stmt.is_decl;
    *p_Var1 = (_Bool)(*p_Var1 | 2);
    add_upvalue_for_ENV(&local_38);
    parse_statement_list
              (&local_38,
               &((local_38.compiler_state)->main_function->field_2).function_expr.
                function_statement_list);
    end_function(&local_38);
    if (local_38.current_function != (AstNode *)0x0) {
      __assert_fail("parser->current_function == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/parser.c"
                    ,0x775,"void parse_lua_chunk(ParserState *)");
    }
    if (local_38.current_scope != (Scope *)0x0) {
      __assert_fail("parser->current_scope == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/parser.c"
                    ,0x776,"void parse_lua_chunk(ParserState *)");
    }
    if (((local_38.ls)->t).token != 300) {
      error_expected(local_38.ls,300);
    }
  }
  raviX_destroy_lexer(ls);
  return iVar2;
}

Assistant:

int raviX_parse(CompilerState *compiler_state, const char *buffer, size_t buflen, const char *name)
{
	LexerState *lexstate = raviX_init_lexer(compiler_state, buffer, buflen, name);
	ParserState parser_state;
	parser_state_init(&parser_state, lexstate, compiler_state);
	int rc = setjmp(compiler_state->env);
	if (rc == 0) {
		parse_lua_chunk(&parser_state);
	}
	raviX_destroy_lexer(lexstate);
	return rc;
}